

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Option *pOVar1;
  ostream *poVar2;
  int argc_00;
  string *option_description;
  char **argv_00;
  vector<cv::Mat,_std::allocator<cv::Mat>_> image_list;
  arguments args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  image_path;
  App app;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  int local_798 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  int local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_460;
  undefined1 local_448 [32];
  _Alloc_hider local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  int local_408;
  _Alloc_hider local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0 [2];
  undefined8 local_3d0;
  undefined1 local_3c8 [32];
  _Alloc_hider local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  int local_388;
  _Alloc_hider local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370 [2];
  undefined8 local_350;
  App local_348;
  
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  local_7d8._M_string_length = 0;
  local_7d8.field_2._M_local_buf[0] = '\0';
  local_7b8.field_2._M_allocated_capacity = 0x74757074756f2f2e;
  local_7b8.field_2._8_4_ = 0x6976612e;
  local_7b8._M_string_length = 0xc;
  local_7b8.field_2._M_local_buf[0xc] = '\0';
  local_798[0] = 0x19;
  local_790._M_string_length = 0;
  local_790.field_2._M_local_buf[0] = '\0';
  local_770 = 0;
  fStack_76c = 0.0;
  fStack_768 = 1.0;
  fStack_764 = 1.0;
  fStack_760 = 1.0;
  fStack_75c = 1.0;
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_498,"CLI to create timelapse video","");
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
  CLI::App::App(&local_348,&local_498,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"-s,--source","");
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f8,"source directory containing frames","");
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_348,&local_4d8,&local_7d8,&local_4f8,false);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"-o, --output","");
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_538,"output file name [default: output.avi]","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_348,&local_518,&local_7b8,&local_538,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"-f,--frames","");
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_578,"frames for making video [default: 25]","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (&local_348,&local_558,local_798,&local_578,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"-z,--filter","");
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,"Name to filter to be applied to each frame","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_348,&local_598,&local_790,&local_5b8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"-v,--value","");
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f8,"Value of the filter provided in -z/--filter option","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (&local_348,&local_5d8,&local_770,&local_5f8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"-B,--brightness","");
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_638,"Value of brightness to applied to images [default: 0]","");
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_348,&local_618,&fStack_76c,&local_638,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"-S,--sharpness","");
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_678,"Value of sharpness to be applied to the images [default: 1]","");
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_348,&local_658,&fStack_764,&local_678,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"-L,--blur","");
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b8,"Value of blur to be applied to the images [defauly: 1]","");
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_348,&local_698,&fStack_760,&local_6b8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"-T,--contrast","");
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f8,"Value of Contrast to be applied to the images [default: 1]","");
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_348,&local_6d8,&fStack_768,&local_6f8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"-I,--saturation","");
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_738,"Value of saturation to be applied to the images [default: 1]","")
  ;
  option_description = &local_738;
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_348,&local_718,&fStack_75c,option_description,false);
  argc_00 = (int)option_description;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  CLI::App::parse(&local_348,argc,argv);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,banner_abi_cxx11_._M_dataplus._M_p,
             banner_abi_cxx11_._M_string_length);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7f8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_7f8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_7f8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_758,local_7d8._M_dataplus._M_p,
             local_7d8._M_dataplus._M_p + local_7d8._M_string_length);
  read_images(&local_758,&local_7f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  local_3c8._0_8_ = local_3c8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3c8,local_7d8._M_dataplus._M_p,
             local_7d8._M_dataplus._M_p + local_7d8._M_string_length);
  local_3a8._M_p = (pointer)&local_398;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,local_7b8._M_dataplus._M_p,
             local_7b8._M_dataplus._M_p + local_7b8._M_string_length);
  local_388 = local_798[0];
  local_380._M_p = (pointer)local_370;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,local_790._M_dataplus._M_p,
             local_790._M_dataplus._M_p + local_790._M_string_length);
  local_350._4_4_ = fStack_75c;
  local_350._0_4_ = fStack_760;
  local_370[1]._4_4_ = fStack_76c;
  local_370[1]._0_4_ = local_770;
  local_370[1]._12_4_ = fStack_764;
  local_370[1]._8_4_ = fStack_768;
  apply_filter(&local_7f8,(arguments *)local_3c8,argv_00,argc_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_p != local_370) {
    operator_delete(local_380._M_p,local_370[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_p != &local_398) {
    operator_delete(local_3a8._M_p,local_398._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
  }
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_460,&local_7f8);
  local_448._0_8_ = local_448 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_448,local_7d8._M_dataplus._M_p,
             local_7d8._M_dataplus._M_p + local_7d8._M_string_length);
  local_428._M_p = (pointer)&local_418;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_428,local_7b8._M_dataplus._M_p,
             local_7b8._M_dataplus._M_p + local_7b8._M_string_length);
  local_408 = local_798[0];
  local_400._M_p = (pointer)local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_790._M_dataplus._M_p,
             local_790._M_dataplus._M_p + local_790._M_string_length);
  local_3d0._4_4_ = fStack_75c;
  local_3d0._0_4_ = fStack_760;
  local_3f0[1]._4_4_ = fStack_76c;
  local_3f0[1]._0_4_ = local_770;
  local_3f0[1]._12_4_ = fStack_764;
  local_3f0[1]._8_4_ = fStack_768;
  make_timelapse(&local_460,(arguments *)local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_p != local_3f0) {
    operator_delete(local_400._M_p,local_3f0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_p != &local_418) {
    operator_delete(local_428._M_p,local_418._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_448._0_8_ != local_448 + 0x10) {
    operator_delete((void *)local_448._0_8_,local_448._16_8_ + 1);
  }
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_460);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::green_abi_cxx11_,DAT_001595f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nFinished : Timelapse Ready",0x1b);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,color::reset_abi_cxx11_,DAT_00159670);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_7f8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_478);
  CLI::App::~App(&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,
                    CONCAT71(local_790.field_2._M_allocated_capacity._1_7_,
                             local_790.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,
                    CONCAT71(local_7d8.field_2._M_allocated_capacity._1_7_,
                             local_7d8.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   // CLI logic
   arguments args;
   CLI::App app{"CLI to create timelapse video"};
   // CLI options
   app.add_option("-s,--source", args.source_dir, "source directory containing frames")->required();
   app.add_option("-o, --output", args.output_file_name, "output file name [default: output.avi]");
   app.add_option("-f,--frames", args.frames, "frames for making video [default: 25]");
   app.add_option("-z,--filter", args.filter_name, "Name to filter to be applied to each frame");
   app.add_option("-v,--value", args.filter_value, "Value of the filter provided in -z/--filter option");
   app.add_option("-B,--brightness", args.brightness_value, "Value of brightness to applied to images [default: 0]");
   app.add_option("-S,--sharpness",args.sharpness_value, "Value of sharpness to be applied to the images [default: 1]");
   app.add_option("-L,--blur", args.blur_value, "Value of blur to be applied to the images [defauly: 1]");
   app.add_option("-T,--contrast", args.contrast_value, "Value of Contrast to be applied to the images [default: 1]");
   app.add_option("-I,--saturation", args.saturation_value, "Value of saturation to be applied to the images [default: 1]");
   CLI11_PARSE(app, argc, argv);
   std::cout << banner;
   std::cout << endl;

   // application logic
   std::vector<std::string> image_path;
   std::vector<cv::Mat> image_list;

   //read image in a vector
   read_images(args.source_dir, image_list);
   // apply filter parameter
   apply_filter(image_list, args, argv, argc);
   // convert collected image to video
   make_timelapse(image_list, args);

   cout << color::green << "\nFinished : Timelapse Ready" << color::reset << std::endl;

   return 0;
}